

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

intmax_t config_find_number_fallback(map *config_map,char *key,intmax_t fallback)

{
  natwm_error nVar1;
  map *local_30;
  intmax_t value;
  intmax_t fallback_local;
  char *key_local;
  map *config_map_local;
  
  local_30 = (map *)0x0;
  value = fallback;
  fallback_local = (intmax_t)key;
  key_local = (char *)config_map;
  nVar1 = config_find_number(config_map,key,(intmax_t *)&local_30);
  if (nVar1 == NO_ERROR) {
    config_map_local = local_30;
  }
  else {
    config_map_local = (map *)value;
  }
  return (intmax_t)config_map_local;
}

Assistant:

intmax_t config_find_number_fallback(const struct map *config_map, const char *key,
                                     intmax_t fallback)
{
        intmax_t value = 0;

        if (config_find_number(config_map, key, &value) != NO_ERROR) {
                return fallback;
        }

        return value;
}